

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O2

size_t duckdb_zstd::HUF_buildCTable_wksp
                 (HUF_CElt *CTable,uint *count,U32 maxSymbolValue,U32 maxNbBits,void *workSpace,
                 size_t wkspSize)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  short sVar4;
  short sVar5;
  undefined4 *puVar6;
  ulong uVar7;
  ushort uVar8;
  int pos;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  nodeElt *huffNode0;
  undefined4 *__s;
  size_t sStack_b0;
  U16 nbPerRank [13];
  ushort auStack_58 [20];
  
  uVar20 = (ulong)(-(int)workSpace & 3);
  __s = (undefined4 *)((long)workSpace + uVar20);
  puVar6 = (undefined4 *)(wkspSize - uVar20);
  if (wkspSize < uVar20) {
    __s = (undefined4 *)0x0;
    puVar6 = (undefined4 *)0x0;
  }
  if (puVar6 < (undefined4 *)0x1300) {
    sStack_b0 = 0xffffffffffffffbe;
  }
  else if (maxSymbolValue < 0x100) {
    switchD_016d4fed::default(__s,0,0x1300);
    for (uVar20 = 0; maxSymbolValue + 1 != uVar20; uVar20 = uVar20 + 1) {
      uVar9 = count[uVar20];
      uVar23 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar23 = (uVar23 ^ 0xffffffe0) + 0xbe;
      if (uVar9 < 0xa5) {
        uVar23 = uVar9;
      }
      *(short *)(__s + (ulong)uVar23 + 0x400) = *(short *)(__s + (ulong)uVar23 + 0x400) + 1;
    }
    for (lVar11 = 0x4bf; lVar11 != 0x400; lVar11 = lVar11 + -1) {
      uVar20 = (ulong)((int)lVar11 - 0x401);
      sVar4 = *(short *)(__s + uVar20 + 0x400);
      sVar5 = *(short *)(__s + lVar11);
      *(short *)(__s + uVar20 + 0x400) = sVar4 + sVar5;
      *(short *)((long)__s + uVar20 * 4 + 0x1002) = sVar4 + sVar5;
    }
    for (uVar20 = 0; maxSymbolValue + 1 != uVar20; uVar20 = uVar20 + 1) {
      uVar9 = count[uVar20];
      uVar23 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar23 = (uVar23 ^ 0xffffffe0) + 0xbe;
      if (uVar9 < 0xa5) {
        uVar23 = uVar9;
      }
      uVar8 = *(ushort *)((long)__s + (ulong)uVar23 * 4 + 0x1006);
      *(ushort *)((long)__s + (ulong)uVar23 * 4 + 0x1006) = uVar8 + 1;
      __s[(ulong)uVar8 * 2 + 2] = uVar9;
      *(char *)((long)__s + (ulong)uVar8 * 8 + 0xe) = (char)uVar20;
    }
    for (lVar11 = 0x4a5; lVar11 != 0x4bf; lVar11 = lVar11 + 1) {
      iVar16 = (uint)*(ushort *)((long)__s + lVar11 * 4 + 2) - (uint)*(ushort *)(__s + lVar11);
      if (1 < iVar16) {
        HUF_simpleQuickSort((nodeElt *)(__s + (ulong)*(ushort *)(__s + lVar11) * 2 + 2),0,
                            iVar16 + -1);
      }
    }
    uVar7 = (ulong)maxSymbolValue;
    uVar20 = uVar7 + 1;
    lVar11 = (uVar7 << 0x20) + 0x10000000000;
    uVar9 = maxSymbolValue + 0xff;
    do {
      uVar23 = uVar9;
      lVar11 = lVar11 + -0x100000000;
      lVar18 = uVar20 * 2;
      uVar20 = uVar20 - 1;
      uVar9 = uVar23 - 1;
    } while (__s[lVar18] == 0);
    __s[0x202] = __s[lVar18] + __s[uVar20 * 2];
    *(undefined2 *)(__s + uVar20 * 2 + 1) = 0x100;
    *(undefined2 *)(__s + uVar20 * 2 + 3) = 0x100;
    lVar11 = lVar11 >> 0x20;
    for (lVar18 = 0x101; lVar18 <= lVar11; lVar18 = lVar18 + 1) {
      __s[lVar18 * 2 + 2] = 0x40000000;
    }
    iVar16 = uVar23 - 0x101;
    *__s = 0x80000000;
    iVar24 = 0x100;
    for (lVar18 = 0x101; lVar18 <= lVar11; lVar18 = lVar18 + 1) {
      uVar23 = __s[(long)iVar16 * 2 + 2];
      uVar25 = __s[(long)iVar24 * 2 + 2];
      iVar22 = (iVar24 + 1) - (uint)(uVar23 < uVar25);
      iVar17 = iVar24;
      if (uVar23 < uVar25) {
        iVar17 = iVar16;
      }
      uVar10 = (uint)(uVar23 < uVar25);
      iVar19 = iVar16 - uVar10;
      uVar23 = __s[(long)iVar19 * 2 + 2];
      uVar25 = __s[(long)iVar22 * 2 + 2];
      iVar24 = (iVar22 + 1) - (uint)(uVar23 < uVar25);
      iVar16 = (iVar16 - uVar10) - (uint)(uVar23 < uVar25);
      if (uVar23 < uVar25) {
        iVar22 = iVar19;
      }
      __s[lVar18 * 2 + 2] = __s[(long)iVar22 * 2 + 2] + __s[(long)iVar17 * 2 + 2];
      *(short *)(__s + (long)iVar22 * 2 + 3) = (short)lVar18;
      *(short *)(__s + (long)iVar17 * 2 + 3) = (short)lVar18;
    }
    *(undefined1 *)((long)__s + lVar11 * 8 + 0xf) = 0;
    for (uVar12 = (ulong)uVar9; 0xff < (int)uVar12; uVar12 = uVar12 - 1) {
      *(char *)((long)__s + uVar12 * 8 + 0xf) =
           *(char *)((long)__s + (ulong)*(ushort *)(__s + uVar12 * 2 + 3) * 8 + 0xf) + '\x01';
    }
    iVar16 = (int)uVar20;
    lVar11 = (long)iVar16;
    if ((long)iVar16 < 0) {
      lVar11 = -1;
    }
    for (lVar18 = 0; lVar11 + 1 != lVar18; lVar18 = lVar18 + 1) {
      *(char *)((long)__s + lVar18 * 8 + 0xf) =
           *(char *)((long)__s + (ulong)*(ushort *)(__s + lVar18 * 2 + 3) * 8 + 0xf) + '\x01';
    }
    uVar9 = 0xb;
    if (maxNbBits != 0) {
      uVar9 = maxNbBits;
    }
    bVar2 = *(byte *)((long)__s + (uVar20 & 0xffffffff) * 8 + 0xf);
    iVar24 = bVar2 - uVar9;
    if (uVar9 <= bVar2 && iVar24 != 0) {
      bVar13 = (byte)iVar24;
      uVar20 = (long)iVar16 + 1;
      iVar24 = 0;
      while (bVar3 = *(byte *)((long)__s + uVar20 * 8 + 7), uVar9 < bVar3) {
        iVar24 = iVar24 + (1 << (bVar13 & 0x1f)) + (-1 << (bVar2 - bVar3 & 0x1f));
        *(char *)((long)__s + uVar20 * 8 + 7) = (char)uVar9;
        uVar20 = uVar20 - 1;
      }
      do {
        lVar11 = uVar20 * 8;
        uVar20 = uVar20 - 1;
      } while (uVar9 == *(byte *)((long)__s + lVar11 + 7));
      nbPerRank[8] = 0xf0f0;
      nbPerRank[9] = 0xf0f0;
      nbPerRank[10] = 0xf0f0;
      nbPerRank[0xb] = 0xf0f0;
      nbPerRank[0xc] = 0xf0f0;
      nbPerRank[0] = 0xf0f0;
      nbPerRank[1] = 0xf0f0;
      nbPerRank[2] = 0xf0f0;
      nbPerRank[3] = 0xf0f0;
      nbPerRank[4] = 0xf0f0;
      nbPerRank[5] = 0xf0f0;
      nbPerRank[6] = 0xf0f0;
      nbPerRank[7] = 0xf0f0;
      uVar12 = uVar20 & 0xffffffff;
      uVar23 = uVar9;
      while (iVar17 = (int)uVar12, -1 < iVar17) {
        bVar2 = *(byte *)((long)__s + uVar12 * 8 + 0xf);
        if (bVar2 < uVar23) {
          uVar23 = (uint)bVar2;
          *(int *)(nbPerRank + (ulong)(uVar9 - uVar23) * 2) = iVar17;
        }
        uVar12 = (ulong)(iVar17 - 1);
      }
      uVar23 = iVar24 >> (bVar13 & 0x1f);
      do {
        if ((int)uVar23 < 1) {
          do {
            iVar24 = nbPerRank._4_4_ + 0xf0f0f10;
            iVar17 = 0;
            uVar25 = uVar23;
            while( true ) {
              nbPerRank._4_4_ = nbPerRank._4_4_ + 1;
              if (-1 < (int)uVar25) goto LAB_01bd3031;
              if (iVar24 == iVar17) break;
              pcVar1 = (char *)((long)__s + (ulong)(uint)nbPerRank._4_4_ * 8 + 0xf);
              *pcVar1 = *pcVar1 + -1;
              uVar25 = uVar25 + 1;
              iVar17 = iVar17 + -1;
            }
            iVar24 = (int)uVar20;
            uVar20 = (long)iVar24 + 1;
            nbPerRank._4_4_ = iVar24 + 2;
            do {
              lVar11 = uVar20 * 8;
              uVar20 = uVar20 - 1;
              nbPerRank._4_4_ = nbPerRank._4_4_ - 1;
            } while (uVar9 == *(byte *)((long)__s + lVar11 + 7));
            pcVar1 = (char *)((long)__s + (long)(int)nbPerRank._4_4_ * 8 + 0xf);
            *pcVar1 = *pcVar1 + -1;
            uVar23 = (uVar23 - iVar17) + 1;
          } while( true );
        }
        uVar25 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar25 == 0; uVar25 = uVar25 - 1) {
          }
        }
        for (uVar12 = (ulong)((uVar25 ^ 0xffffffe0) + 0x21); 1 < uVar12; uVar12 = uVar12 - 1) {
          if (((ulong)*(uint *)(nbPerRank + uVar12 * 2) != 0xf0f0f0f0) &&
             ((*(uint *)(nbPerRank + (ulong)((int)uVar12 - 1) * 2) == 0xf0f0f0f0 ||
              ((uint)__s[(ulong)*(uint *)(nbPerRank + uVar12 * 2) * 2 + 2] <=
               (uint)(__s[(ulong)*(uint *)(nbPerRank + (ulong)((int)uVar12 - 1) * 2) * 2 + 2] * 2)))
             )) goto LAB_01bd30dd;
        }
        uVar12 = 1;
LAB_01bd30dd:
        uVar15 = uVar12 & 0xffffffff;
        uVar26 = uVar12 & 0xffffffff;
        if ((uint)uVar12 < 0xe) {
          uVar26 = 0xd;
        }
        for (; uVar25 = (uint)uVar26, uVar15 < 0xd; uVar15 = uVar15 + 1) {
          if (*(int *)(nbPerRank + uVar15 * 2) != -0xf0f0f10) {
            uVar25 = (uint)uVar15;
            break;
          }
        }
        uVar14 = uVar25 - 1;
        uVar10 = *(uint *)(nbPerRank + (ulong)uVar25 * 2);
        pcVar1 = (char *)((long)__s + (ulong)uVar10 * 8 + 0xf);
        *pcVar1 = *pcVar1 + '\x01';
        uVar21 = *(uint *)(nbPerRank + (ulong)uVar14 * 2);
        if (*(uint *)(nbPerRank + (ulong)uVar14 * 2) == 0xf0f0f0f0) {
          uVar21 = uVar10;
        }
        *(uint *)(nbPerRank + (ulong)uVar14 * 2) = uVar21;
        if ((ulong)uVar10 == 0) {
          uVar10 = 0xf0f0f0f0;
        }
        else {
          uVar10 = uVar10 - 1;
          if (uVar9 - uVar25 != (uint)*(byte *)((long)__s + (ulong)uVar10 * 8 + 0xf)) {
            uVar10 = 0xf0f0f0f0;
          }
        }
        uVar23 = uVar23 + (-1 << ((byte)uVar14 & 0x1f));
        *(uint *)(nbPerRank + (ulong)uVar25 * 2) = uVar10;
      } while( true );
    }
    uVar9 = (uint)bVar2;
LAB_01bd3031:
    sStack_b0 = 0xffffffffffffffff;
    if (uVar9 < 0xd) {
      nbPerRank[8] = 0;
      nbPerRank[9] = 0;
      nbPerRank[10] = 0;
      nbPerRank[0xb] = 0;
      nbPerRank[0xc] = 0;
      nbPerRank[0] = 0;
      nbPerRank[1] = 0;
      nbPerRank[2] = 0;
      nbPerRank[3] = 0;
      nbPerRank[4] = 0;
      nbPerRank[5] = 0;
      nbPerRank[6] = 0;
      nbPerRank[7] = 0;
      auStack_58[8] = 0;
      auStack_58[9] = 0;
      auStack_58[10] = 0;
      auStack_58[0xb] = 0;
      auStack_58[0xc] = 0;
      auStack_58[0] = 0;
      auStack_58[1] = 0;
      auStack_58[2] = 0;
      auStack_58[3] = 0;
      auStack_58[4] = 0;
      auStack_58[5] = 0;
      auStack_58[6] = 0;
      auStack_58[7] = 0;
      lVar11 = -1;
      if (-1 < (long)iVar16) {
        lVar11 = (long)iVar16;
      }
      for (lVar18 = 0; lVar11 + 1 != lVar18; lVar18 = lVar18 + 1) {
        nbPerRank[*(byte *)((long)__s + lVar18 * 8 + 0xf)] =
             nbPerRank[*(byte *)((long)__s + lVar18 * 8 + 0xf)] + 1;
      }
      uVar8 = 0;
      sStack_b0 = (size_t)uVar9;
      for (uVar20 = sStack_b0; 0 < (long)uVar20; uVar20 = uVar20 - 1) {
        auStack_58[uVar20] = uVar8;
        uVar8 = (ushort)(uVar8 + nbPerRank[uVar20]) >> 1;
      }
      for (lVar11 = 0; uVar7 + 1 != lVar11; lVar11 = lVar11 + 1) {
        CTable[(ulong)*(byte *)((long)__s + lVar11 * 8 + 0xe) + 1] =
             (ulong)*(byte *)((long)__s + lVar11 * 8 + 0xf);
      }
      for (lVar11 = 0; uVar7 + 1 != lVar11; lVar11 = lVar11 + 1) {
        uVar20 = CTable[lVar11 + 1];
        uVar12 = uVar20 & 0xff;
        uVar8 = auStack_58[uVar12];
        auStack_58[uVar12] = uVar8 + 1;
        if (uVar12 != 0) {
          CTable[lVar11 + 1] = (ulong)uVar8 << (-(char)uVar20 & 0x3fU) | uVar20;
        }
      }
      *(char *)CTable = (char)uVar9;
      *(char *)((long)CTable + 1) = (char)maxSymbolValue;
      *(undefined4 *)((long)CTable + 2) = 0;
      *(undefined2 *)((long)CTable + 6) = 0;
    }
  }
  else {
    sStack_b0 = 0xffffffffffffffd2;
  }
  return sStack_b0;
}

Assistant:

size_t
HUF_buildCTable_wksp(HUF_CElt* CTable, const unsigned* count, U32 maxSymbolValue, U32 maxNbBits,
                     void* workSpace, size_t wkspSize)
{
    HUF_buildCTable_wksp_tables* const wksp_tables =
        (HUF_buildCTable_wksp_tables*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(U32));
    nodeElt* const huffNode0 = wksp_tables->huffNodeTbl;
    nodeElt* const huffNode = huffNode0+1;
    int nonNullRank;

    HUF_STATIC_ASSERT(HUF_CTABLE_WORKSPACE_SIZE == sizeof(HUF_buildCTable_wksp_tables));

    DEBUGLOG(5, "HUF_buildCTable_wksp (alphabet size = %u)", maxSymbolValue+1);

    /* safety checks */
    if (wkspSize < sizeof(HUF_buildCTable_wksp_tables))
        return ERROR(workSpace_tooSmall);
    if (maxNbBits == 0) maxNbBits = HUF_TABLELOG_DEFAULT;
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX)
        return ERROR(maxSymbolValue_tooLarge);
    ZSTD_memset(huffNode0, 0, sizeof(huffNodeTable));

    /* sort, decreasing order */
    HUF_sort(huffNode, count, maxSymbolValue, wksp_tables->rankPosition);
    DEBUGLOG(6, "sorted symbols completed (%zu symbols)", showHNodeSymbols(huffNode, maxSymbolValue+1));

    /* build tree */
    nonNullRank = HUF_buildTree(huffNode, maxSymbolValue);

    /* determine and enforce maxTableLog */
    maxNbBits = HUF_setMaxHeight(huffNode, (U32)nonNullRank, maxNbBits);
    if (maxNbBits > HUF_TABLELOG_MAX) return ERROR(GENERIC);   /* check fit into table */

    HUF_buildCTableFromTree(CTable, huffNode, nonNullRank, maxSymbolValue, maxNbBits);

    return maxNbBits;
}